

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IResultCapture * Catch::getResultCapture(void)

{
  IResultCapture *pIVar1;
  SourceLineInfo local_58;
  ReusableStringStream local_48;
  string local_30;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_00236920;
    IMutableContext::currentContext[1] = (long)&PTR__Context_00236970;
  }
  pIVar1 = (IResultCapture *)(**(code **)(*IMutableContext::currentContext + 0x10))();
  if (pIVar1 != (IResultCapture *)0x0) {
    return pIVar1;
  }
  ReusableStringStream::ReusableStringStream(&local_48);
  local_58.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp"
  ;
  local_58.line = 0x3354;
  operator<<(local_48.m_oss,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_48.m_oss,": Internal Catch2 error: ",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_48.m_oss,"No result capture instance",0x1a);
  std::__cxx11::stringbuf::str();
  throw_logic_error(&local_30);
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }